

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O0

bov_text_t * bov_text_update(bov_text_t *text,GLubyte *string)

{
  int len;
  GLsizei GVar1;
  size_t sVar2;
  GLfloat *pGVar3;
  GLsizei newLen;
  GLubyte *string_local;
  bov_text_t *text_local;
  
  sVar2 = strlen((char *)string);
  len = (int)sVar2;
  if (text->dataCapacity < len) {
    free(text->data);
    pGVar3 = (GLfloat *)malloc((long)len * 0x60);
    text->data = pGVar3;
    if (text->data == (GLfloat *)0x0) {
      bov_error_log(0x30001,"Memory allocation failed");
      fprintf(_stderr,"\t(in function %s, line %d)\n","bov_text_update",0x4cb);
      exit(1);
    }
    text->dataCapacity = len;
  }
  GVar1 = fill_text_data(text->data,string,len);
  text->vboLen = GVar1;
  (*glad_glBindBuffer)(0x8892,text->vbo);
  if (text->vboCapacity < text->vboLen) {
    (*glad_glBufferData)(0x8892,(long)text->vboLen * 0x60,text->data,0x88e8);
    text->vboCapacity = text->vboLen;
  }
  else {
    (*glad_glBufferSubData)(0x8892,0,(long)text->vboLen * 0x60,text->data);
  }
  return text;
}

Assistant:

bov_text_t* bov_text_update(bov_text_t* text, const GLubyte* string)
{
	// see if the length is not longer than the original string
	GLsizei newLen = (GLsizei) strlen((const char*)string);

	if(newLen > text->dataCapacity) {
		free(text->data);
		text->data = malloc(sizeof(GLfloat) * 24 * newLen);
		CHECK_MALLOC(text->data);
		text->dataCapacity = newLen;
	}


	// text->string = string;
	text->vboLen = fill_text_data(text->data, string, newLen);

	glBindBuffer(GL_ARRAY_BUFFER, text->vbo);
	if(text->vboLen > text->vboCapacity) {
		glBufferData(GL_ARRAY_BUFFER,
		             sizeof(GLfloat) * 24 * text->vboLen,
		             text->data,
		             GL_DYNAMIC_DRAW);
		text->vboCapacity = text->vboLen;
	}
	else{
		glBufferSubData(GL_ARRAY_BUFFER,
		                0,
		                sizeof(GLfloat) * 24 * text->vboLen,
		                text->data);
	}

	return text;
}